

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O2

TCHAR * AppendBlobText(TCHAR *szBuffer,LPBYTE pbData,size_t cbData,TCHAR chSeparator)

{
  size_t sVar1;
  
  if (chSeparator != '\0') {
    *szBuffer = chSeparator;
    szBuffer = szBuffer + 1;
  }
  for (sVar1 = 0; cbData != sVar1; sVar1 = sVar1 + 1) {
    *szBuffer = IntToHexChar[pbData[sVar1] >> 4];
    ((uchar *)szBuffer)[1] = IntToHexChar[pbData[sVar1] & 0xf];
    szBuffer = (TCHAR *)((uchar *)szBuffer + 2);
  }
  *szBuffer = '\0';
  return szBuffer;
}

Assistant:

TCHAR * AppendBlobText(TCHAR * szBuffer, LPBYTE pbData, size_t cbData, TCHAR chSeparator)
{
    // Put the separator, if any
    if(chSeparator != 0)
        *szBuffer++ = chSeparator;

    // Copy the blob data as text
    for(size_t i = 0; i < cbData; i++)
    {
        *szBuffer++ = IntToHexChar[pbData[0] >> 0x04];
        *szBuffer++ = IntToHexChar[pbData[0] & 0x0F];
        pbData++;
    }

    // Terminate the string
    *szBuffer = 0;

    // Return new buffer position
    return szBuffer;
}